

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O0

TConstUnion __thiscall glslang::TConstUnion::operator||(TConstUnion *this,TConstUnion *constant)

{
  TConstUnion TVar1;
  byte local_31;
  TConstUnion *constant_local;
  TConstUnion *this_local;
  TConstUnion returnValue;
  
  TConstUnion((TConstUnion *)&this_local);
  if (this->type != constant->type) {
    __assert_fail("type == constant.type",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x343,"TConstUnion glslang::TConstUnion::operator||(const TConstUnion &) const");
  }
  if (this->type == EbtBool) {
    local_31 = 1;
    if (((this->field_0).u8Const & 1) == 0) {
      local_31 = (constant->field_0).u8Const;
    }
    setBConst((TConstUnion *)&this_local,(bool)(local_31 & 1));
    TVar1._12_4_ = 0;
    TVar1.field_0 = (anon_union_8_11_a9b10978_for_TConstUnion_0)this_local;
    TVar1.type = returnValue.field_0._0_4_;
    return TVar1;
  }
  __assert_fail("false && \"Default missing\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                ,0x346,"TConstUnion glslang::TConstUnion::operator||(const TConstUnion &) const");
}

Assistant:

TConstUnion operator||(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        assert(type == constant.type);
        switch (type) {
        case EbtBool: returnValue.setBConst(bConst || constant.bConst); break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }